

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXBinaryTokenizer.cpp
# Opt level: O0

bool Assimp::FBX::anon_unknown_3::ReadScope
               (TokenList *output_tokens,char *input,char **cursor,char *end,bool is64bits)

{
  char *pcVar1;
  ulong uVar2;
  char *pcVar3;
  uint32_t uVar4;
  size_t sVar5;
  Token *pTVar6;
  char *pcVar7;
  char *local_1e0;
  uint64_t local_1d8;
  ulong local_1b0;
  allocator<char> local_1a1;
  string local_1a0;
  allocator<char> local_179;
  string local_178;
  uint local_154;
  Token *pTStack_150;
  uint i_1;
  Token *local_148;
  allocator<char> local_139;
  string local_138;
  ulong local_118;
  size_t sentinel_block_length;
  string local_108;
  Token *local_e8;
  Token *local_e0;
  uint local_d4;
  char *pcStack_d0;
  uint i;
  char *begin_cursor;
  char *local_c0;
  char *send;
  char *sbeg;
  uint64_t prop_length;
  uint64_t prop_count;
  string local_98;
  allocator<char> local_61;
  string local_60;
  ulong local_40;
  uint64_t end_offset;
  char *pcStack_30;
  bool is64bits_local;
  char *end_local;
  char **cursor_local;
  char *input_local;
  TokenList *output_tokens_local;
  
  end_offset._7_1_ = is64bits;
  pcStack_30 = end;
  end_local = (char *)cursor;
  cursor_local = (char **)input;
  input_local = (char *)output_tokens;
  if (is64bits) {
    local_1b0 = ReadDoubleWord(input,cursor,end);
  }
  else {
    uVar4 = ReadWord(input,cursor,end);
    local_1b0 = (ulong)uVar4;
  }
  local_40 = local_1b0;
  if (local_1b0 == 0) {
    output_tokens_local._7_1_ = false;
  }
  else {
    sVar5 = Offset((char *)cursor_local,pcStack_30);
    uVar2 = local_40;
    if (sVar5 < local_1b0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_60,"block offset is out of range",&local_61);
      TokenizeError(&local_60,(char *)cursor_local,*(char **)end_local);
      std::__cxx11::string::~string((string *)&local_60);
      std::allocator<char>::~allocator(&local_61);
    }
    else {
      sVar5 = Offset((char *)cursor_local,*(char **)end_local);
      if (uVar2 < sVar5) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_98,"block offset is negative out of range",
                   (allocator<char> *)((long)&prop_count + 7));
        TokenizeError(&local_98,(char *)cursor_local,*(char **)end_local);
        std::__cxx11::string::~string((string *)&local_98);
        std::allocator<char>::~allocator((allocator<char> *)((long)&prop_count + 7));
      }
    }
    if ((end_offset._7_1_ & 1) == 0) {
      uVar4 = ReadWord((char *)cursor_local,(char **)end_local,pcStack_30);
      local_1d8 = (uint64_t)uVar4;
    }
    else {
      local_1d8 = ReadDoubleWord((char *)cursor_local,(char **)end_local,pcStack_30);
    }
    prop_length = local_1d8;
    if ((end_offset._7_1_ & 1) == 0) {
      uVar4 = ReadWord((char *)cursor_local,(char **)end_local,pcStack_30);
      local_1e0 = (char *)(ulong)uVar4;
    }
    else {
      local_1e0 = (char *)ReadDoubleWord((char *)cursor_local,(char **)end_local,pcStack_30);
    }
    sbeg = local_1e0;
    ReadString(&send,&local_c0,(char *)cursor_local,(char **)end_local,pcStack_30,false,false);
    pcVar3 = input_local;
    pTVar6 = (Token *)operator_new(0x28);
    pcVar1 = send;
    pcVar7 = local_c0;
    sVar5 = Offset((char *)cursor_local,*(char **)end_local);
    Token::Token(pTVar6,pcVar1,pcVar7,TokenType_KEY,sVar5);
    begin_cursor = (char *)pTVar6;
    std::vector<const_Assimp::FBX::Token_*,_std::allocator<const_Assimp::FBX::Token_*>_>::push_back
              ((vector<const_Assimp::FBX::Token_*,_std::allocator<const_Assimp::FBX::Token_*>_> *)
               pcVar3,(value_type *)&begin_cursor);
    pcStack_d0 = *(char **)end_local;
    for (local_d4 = 0; local_d4 < prop_length; local_d4 = local_d4 + 1) {
      ReadData(&send,&local_c0,(char *)cursor_local,(char **)end_local,pcStack_d0 + (long)sbeg);
      pcVar3 = input_local;
      pTVar6 = (Token *)operator_new(0x28);
      pcVar1 = send;
      pcVar7 = local_c0;
      sVar5 = Offset((char *)cursor_local,*(char **)end_local);
      Token::Token(pTVar6,pcVar1,pcVar7,TokenType_DATA,sVar5);
      local_e0 = pTVar6;
      std::vector<const_Assimp::FBX::Token_*,_std::allocator<const_Assimp::FBX::Token_*>_>::
      push_back((vector<const_Assimp::FBX::Token_*,_std::allocator<const_Assimp::FBX::Token_*>_> *)
                pcVar3,&local_e0);
      pcVar7 = input_local;
      if ((ulong)local_d4 != prop_length - 1) {
        pTVar6 = (Token *)operator_new(0x28);
        pcVar1 = *(char **)end_local;
        sVar5 = Offset((char *)cursor_local,pcVar1);
        Token::Token(pTVar6,pcVar1,pcVar1 + 1,TokenType_COMMA,sVar5);
        local_e8 = pTVar6;
        std::vector<const_Assimp::FBX::Token_*,_std::allocator<const_Assimp::FBX::Token_*>_>::
        push_back((vector<const_Assimp::FBX::Token_*,_std::allocator<const_Assimp::FBX::Token_*>_> *
                  )pcVar7,&local_e8);
      }
    }
    pcVar7 = (char *)Offset(pcStack_d0,*(char **)end_local);
    if (pcVar7 != sbeg) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_108,"property length not reached, something is wrong",
                 (allocator<char> *)((long)&sentinel_block_length + 7));
      TokenizeError(&local_108,(char *)cursor_local,*(char **)end_local);
      std::__cxx11::string::~string((string *)&local_108);
      std::allocator<char>::~allocator((allocator<char> *)((long)&sentinel_block_length + 7));
    }
    local_118 = 0xd;
    if ((end_offset._7_1_ & 1) != 0) {
      local_118 = 0x19;
    }
    sVar5 = Offset((char *)cursor_local,*(char **)end_local);
    uVar2 = local_40;
    if (sVar5 < local_40) {
      sVar5 = Offset((char *)cursor_local,*(char **)end_local);
      if (uVar2 - sVar5 < local_118) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_138,"insufficient padding bytes at block end",&local_139);
        TokenizeError(&local_138,(char *)cursor_local,*(char **)end_local);
        std::__cxx11::string::~string((string *)&local_138);
        std::allocator<char>::~allocator(&local_139);
      }
      pcVar1 = input_local;
      pTVar6 = (Token *)operator_new(0x28);
      pcVar7 = *(char **)end_local;
      sVar5 = Offset((char *)cursor_local,pcVar7);
      Token::Token(pTVar6,pcVar7,pcVar7 + 1,TokenType_OPEN_BRACKET,sVar5);
      local_148 = pTVar6;
      std::vector<const_Assimp::FBX::Token_*,_std::allocator<const_Assimp::FBX::Token_*>_>::
      push_back((vector<const_Assimp::FBX::Token_*,_std::allocator<const_Assimp::FBX::Token_*>_> *)
                pcVar1,&local_148);
      while (sVar5 = Offset((char *)cursor_local,*(char **)end_local), pcVar7 = input_local,
            sVar5 < local_40 - local_118) {
        ReadScope((TokenList *)input_local,(char *)cursor_local,(char **)end_local,
                  (char *)((long)cursor_local + (local_40 - local_118)),(bool)(end_offset._7_1_ & 1)
                 );
      }
      pTVar6 = (Token *)operator_new(0x28);
      pcVar1 = *(char **)end_local;
      sVar5 = Offset((char *)cursor_local,pcVar1);
      Token::Token(pTVar6,pcVar1,pcVar1 + 1,TokenType_CLOSE_BRACKET,sVar5);
      pTStack_150 = pTVar6;
      std::vector<const_Assimp::FBX::Token_*,_std::allocator<const_Assimp::FBX::Token_*>_>::
      push_back((vector<const_Assimp::FBX::Token_*,_std::allocator<const_Assimp::FBX::Token_*>_> *)
                pcVar7,&stack0xfffffffffffffeb0);
      for (local_154 = 0; local_154 < local_118; local_154 = local_154 + 1) {
        if (*(char *)(*(long *)end_local + (ulong)local_154) != '\0') {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_178,
                     "failed to read nested block sentinel, expected all bytes to be 0",&local_179);
          TokenizeError(&local_178,(char *)cursor_local,*(char **)end_local);
          std::__cxx11::string::~string((string *)&local_178);
          std::allocator<char>::~allocator(&local_179);
        }
      }
      *(ulong *)end_local = local_118 + *(long *)end_local;
    }
    sVar5 = Offset((char *)cursor_local,*(char **)end_local);
    if (sVar5 != local_40) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1a0,"scope length not reached, something is wrong",&local_1a1);
      TokenizeError(&local_1a0,(char *)cursor_local,*(char **)end_local);
      std::__cxx11::string::~string((string *)&local_1a0);
      std::allocator<char>::~allocator(&local_1a1);
    }
    output_tokens_local._7_1_ = true;
  }
  return output_tokens_local._7_1_;
}

Assistant:

bool ReadScope(TokenList& output_tokens, const char* input, const char*& cursor, const char* end, bool const is64bits)
{
    // the first word contains the offset at which this block ends
	const uint64_t end_offset = is64bits ? ReadDoubleWord(input, cursor, end) : ReadWord(input, cursor, end);

    // we may get 0 if reading reached the end of the file -
    // fbx files have a mysterious extra footer which I don't know
    // how to extract any information from, but at least it always
    // starts with a 0.
    if(!end_offset) {
        return false;
    }

    if(end_offset > Offset(input, end)) {
        TokenizeError("block offset is out of range",input, cursor);
    }
    else if(end_offset < Offset(input, cursor)) {
        TokenizeError("block offset is negative out of range",input, cursor);
    }

    // the second data word contains the number of properties in the scope
	const uint64_t prop_count = is64bits ? ReadDoubleWord(input, cursor, end) : ReadWord(input, cursor, end);

    // the third data word contains the length of the property list
	const uint64_t prop_length = is64bits ? ReadDoubleWord(input, cursor, end) : ReadWord(input, cursor, end);

    // now comes the name of the scope/key
    const char* sbeg, *send;
    ReadString(sbeg, send, input, cursor, end);

    output_tokens.push_back(new_Token(sbeg, send, TokenType_KEY, Offset(input, cursor) ));

    // now come the individual properties
    const char* begin_cursor = cursor;
    for (unsigned int i = 0; i < prop_count; ++i) {
        ReadData(sbeg, send, input, cursor, begin_cursor + prop_length);

        output_tokens.push_back(new_Token(sbeg, send, TokenType_DATA, Offset(input, cursor) ));

        if(i != prop_count-1) {
            output_tokens.push_back(new_Token(cursor, cursor + 1, TokenType_COMMA, Offset(input, cursor) ));
        }
    }

    if (Offset(begin_cursor, cursor) != prop_length) {
        TokenizeError("property length not reached, something is wrong",input, cursor);
    }

    // at the end of each nested block, there is a NUL record to indicate
    // that the sub-scope exists (i.e. to distinguish between P: and P : {})
    // this NUL record is 13 bytes long on 32 bit version and 25 bytes long on 64 bit.
	const size_t sentinel_block_length = is64bits ? (sizeof(uint64_t)* 3 + 1) : (sizeof(uint32_t)* 3 + 1);

    if (Offset(input, cursor) < end_offset) {
        if (end_offset - Offset(input, cursor) < sentinel_block_length) {
            TokenizeError("insufficient padding bytes at block end",input, cursor);
        }

        output_tokens.push_back(new_Token(cursor, cursor + 1, TokenType_OPEN_BRACKET, Offset(input, cursor) ));

        // XXX this is vulnerable to stack overflowing ..
        while(Offset(input, cursor) < end_offset - sentinel_block_length) {
			ReadScope(output_tokens, input, cursor, input + end_offset - sentinel_block_length, is64bits);
        }
        output_tokens.push_back(new_Token(cursor, cursor + 1, TokenType_CLOSE_BRACKET, Offset(input, cursor) ));

        for (unsigned int i = 0; i < sentinel_block_length; ++i) {
            if(cursor[i] != '\0') {
                TokenizeError("failed to read nested block sentinel, expected all bytes to be 0",input, cursor);
            }
        }
        cursor += sentinel_block_length;
    }

    if (Offset(input, cursor) != end_offset) {
        TokenizeError("scope length not reached, something is wrong",input, cursor);
    }

    return true;
}